

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O1

int __thiscall Clasp::DefaultUnfoundedCheck::init(DefaultUnfoundedCheck *this,EVP_PKEY_CTX *ctx)

{
  size_type sVar1;
  LitVec *pLVar2;
  void *pvVar3;
  pointer pAVar4;
  pointer pBVar5;
  bool bVar6;
  byte bVar7;
  UfsType UVar8;
  uint32 uVar9;
  MinimalityCheck *this_00;
  SolveParams *pSVar10;
  size_type sVar11;
  int iVar12;
  ulong unaff_RBP;
  pointer pAVar13;
  ReasonStrategy rs;
  uint uVar14;
  ulong uVar15;
  size_type i;
  size_type sVar16;
  long lVar17;
  byte bVar19;
  Literal local_54;
  BodyPtr local_50;
  size_type local_3c;
  ulong local_38;
  ulong uVar18;
  
  pLVar2 = this->reasons_;
  if (pLVar2 != (LitVec *)0x0) {
    lVar17._0_4_ = pLVar2[-1].ebo_.size;
    lVar17._4_4_ = pLVar2[-1].ebo_.cap;
    if (lVar17 != 0) {
      lVar17 = lVar17 << 4;
      do {
        pvVar3 = *(void **)((long)&pLVar2[-1].ebo_.buf + lVar17);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3);
        }
        lVar17 = lVar17 + -0x10;
      } while (lVar17 != 0);
    }
    operator_delete__(&pLVar2[-1].ebo_.size);
  }
  this->reasons_ = (LitVec *)0x0;
  this->solver_ = (Solver *)ctx;
  rs = no_reason;
  if ((*(ulong *)(ctx + 0x70) >> 0x33 & 1) == 0) {
    rs = this->strategy_;
  }
  setReasonStrategy(this,rs);
  UVar8 = findUfs(this,(Solver *)ctx,false);
  if (UVar8 != ufs_none) {
    do {
      while (uVar14 = (this->ufs_).qFront, uVar14 != (this->ufs_).vec.ebo_.size) {
        local_54.rep_ =
             (this->graph_->atoms_).ebo_.buf[(this->ufs_).vec.ebo_.buf[uVar14]].super_Node.lit.rep_
             & 0xfffffffe ^ 2;
        local_50.node = (BodyNode *)0x0;
        bVar6 = Solver::force((Solver *)ctx,&local_54,(Antecedent *)&local_50);
        if (!bVar6) {
          return 0;
        }
        uVar14 = (this->ufs_).qFront;
        (this->ufs_).qFront = uVar14 + 1;
        pAVar4 = (this->atoms_).ebo_.buf + (this->ufs_).vec.ebo_.buf[uVar14];
        *pAVar4 = (AtomData)((uint)*pAVar4 & 0xbfffffff);
      }
      UVar8 = findUfs(this,(Solver *)ctx,false);
    } while (UVar8 != ufs_none);
  }
  local_38 = (ulong)(this->atoms_).ebo_.size;
  local_50.node = (BodyNode *)CONCAT44(local_50.node._4_4_,0x1fffffff);
  bk_lib::
  pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
  ::resize(&this->atoms_,(this->graph_->atoms_).ebo_.size,(AtomData *)&local_50);
  pAVar4 = (this->atoms_).ebo_.buf;
  *pAVar4 = (AtomData)((uint)*pAVar4 | 0xe0000000);
  sVar11 = (this->bodies_).ebo_.size;
  if (sVar11 != (this->graph_->bodies_).ebo_.size) {
    do {
      local_50.node = (BodyNode *)((ulong)local_50.node & 0xffffffff00000000);
      bk_lib::
      pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
      ::push_back(&this->bodies_,(BodyData *)&local_50);
      local_50.node = (this->graph_->bodies_).ebo_.buf + sVar11;
      local_50.id = sVar11;
      if ((((local_50.node)->super_Node).field_0x7 & 0x10) == 0) {
        pBVar5 = (this->bodies_).ebo_.buf;
        uVar9 = Asp::PrgDepGraph::BodyNode::num_preds(local_50.node);
        pBVar5[sVar11].lower_or_ext = uVar9;
        initSuccessors(this,&local_50,uVar9);
      }
      else {
        initExtBody(this,&local_50);
      }
      Solver::addWatch(this->solver_,
                       (Literal)(((local_50.node)->super_Node).lit.rep_ & 0xfffffffe ^ 2),
                       (Constraint *)this,local_50.id << 2);
      sVar11 = sVar11 + 1;
      unaff_RBP = (ulong)sVar11;
    } while (sVar11 != (this->graph_->bodies_).ebo_.size);
  }
  propagateSource(this);
  uVar18 = local_38;
  local_3c = (this->atoms_).ebo_.size;
  sVar16 = (size_type)local_38;
  iVar12 = (int)CONCAT71((int7)(unaff_RBP >> 8),sVar16 == local_3c);
  if (sVar16 != local_3c) {
    uVar9 = sVar16 * 4 + 1;
    uVar15 = local_38 & 0xffffffff;
    do {
      pAVar13 = (this->graph_->atoms_).ebo_.buf + uVar15;
      if (-1 < (int)(this->atoms_).ebo_.buf[uVar15]) {
        local_54.rep_ = (pAVar13->super_Node).lit.rep_ & 0xfffffffe ^ 2;
        local_50.node = (BodyNode *)0x0;
        bVar6 = Solver::force(this->solver_,&local_54,(Antecedent *)&local_50);
        if (!bVar6) {
          return 0;
        }
      }
      if (((pAVar13->super_Node).field_0x7 & 0x10) != 0) {
        Solver::addWatch(this->solver_,(Literal)((pAVar13->super_Node).lit.rep_ & 0xfffffffe ^ 2),
                         (Constraint *)this,uVar9);
      }
      uVar14 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar14;
      uVar9 = uVar9 + 4;
      iVar12 = (int)CONCAT71((int7)((ulong)pAVar13 >> 8),local_3c == uVar14);
    } while (local_3c != uVar14);
  }
  if ((this->graph_->components_).ebo_.size != 0) {
    this_00 = (MinimalityCheck *)operator_new(0x18);
    pSVar10 = Solver::searchConfig((Solver *)ctx);
    MinimalityCheck::MinimalityCheck(this_00,&pSVar10->fwdCheck);
    SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>::reset
              (&this->mini_,this_00);
    bVar7 = *(byte *)(((this->mini_).ptr_ & 0xfffffffffffffffe) + 4);
    bVar19 = bVar7 & 3;
    if ((bVar7 & 3) != 0) {
      sVar1 = (this->atoms_).ebo_.size;
      while (sVar16 != sVar1) {
        pAVar13 = (this->graph_->atoms_).ebo_.buf;
        if ((pAVar13[uVar18 & 0xffffffff].super_Node.field_0x7 & 0x20) != 0) {
          uVar14 = pAVar13[uVar18 & 0xffffffff].super_Node.lit.rep_;
          if ((*(byte *)((long)(this->solver_->assign_).assign_.ebo_.buf +
                        (ulong)(uVar14 & 0xfffffffc)) & 3) == 0) {
            bVar7 = ((uVar14 & 2) == 0) + 1;
            if ((bVar19 == 1) || ((bVar19 == 3 && ((uVar18 & 1) != 0)))) {
              bVar7 = bVar7 ^ 3;
            }
            Solver::setPref(this->solver_,uVar14 >> 2,def_value,bVar7);
          }
        }
        sVar16 = (int)uVar18 + 1;
        uVar18 = (ulong)sVar16;
      }
    }
  }
  return iVar12;
}

Assistant:

bool DefaultUnfoundedCheck::init(Solver& s) {
	assert(!solver_ || solver_ == &s);
	delete[] reasons_;
	reasons_ = 0;
	solver_  = &s;
	setReasonStrategy(s.searchMode() != SolverStrategies::no_learning ? strategy_ : no_reason);
	// process any leftovers from previous steps
	while (findUfs(s, false) != ufs_none) {
		while (!ufs_.empty()) {
			if (!s.force(~graph_->getAtom(ufs_.front()).lit, 0)) { return false; }
			atoms_[ufs_.pop_ret()].ufs = 0;
		}
	}
	AtomVec::size_type startAtom = atoms_.size();
	// set up new atoms
	atoms_.resize(graph_->numAtoms());
	AtomData& sentinel = atoms_[DependencyGraph::sentinel_atom];
	sentinel.resurrectSource();
	sentinel.todo = 1;
	sentinel.ufs  = 1;
	// set up new bodies
	for (uint32 i = (uint32)bodies_.size(); i != graph_->numBodies(); ++i) {
		bodies_.push_back(BodyData());
		BodyPtr n(getBody(i));
		if (!n.node->extended()) {
			initBody(n);
		}
		else {
			initExtBody(n);
		}
		// when a body becomes false, it can no longer be used as source
		addWatch(~n.node->lit, n.id, watch_source_false);
	}
	// check for initially unfounded atoms
	propagateSource();
	for (AtomVec::size_type i = startAtom, end = atoms_.size(); i != end; ++i) {
		const AtomNode& a = graph_->getAtom(NodeId(i));
		if (!atoms_[i].hasSource() && !solver_->force(~a.lit, 0)) {
			return false;
		}
		if (a.inChoice()) {
			addWatch(~a.lit, NodeId(i), watch_head_false);
		}
	}
	if (graph_->numNonHcfs() != 0) {
		mini_ = new MinimalityCheck(s.searchConfig().fwdCheck);
		if (const uint32 sd = mini_->fwd.signDef) {
			for (AtomVec::size_type i = startAtom, end = atoms_.size(); i != end; ++i) {
				const AtomNode& a = graph_->getAtom(NodeId(i));
				if (a.inDisjunctive() && solver_->value(a.lit.var()) == value_free) {
					ValueRep v = falseValue(a.lit);
					if (sd == SolverStrategies::sign_pos || (sd == SolverStrategies::sign_rnd && (i & 1) != 0)) {
						v ^= static_cast<ValueRep>(3u);
					}
					solver_->setPref(a.lit.var(), ValueSet::def_value, v);
				}
			}
		}
	}
	return true;
}